

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUTF8.cxx
# Opt level: O3

int testUTF8(int param_1,char **param_2)

{
  test_utf8_char *first;
  uint uVar1;
  char *pcVar2;
  int iVar3;
  test_utf8_entry *ptVar4;
  uint uVar5;
  char *pcVar6;
  uint uc;
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  ptVar4 = good_entry;
  pcVar6 = (char *)((long)&local_48 + 4);
  iVar3 = 0;
  do {
    ptVar4 = ptVar4 + 1;
    local_48._0_4_ = ptVar4[-1].n;
    local_48._4_1_ = ptVar4[-1].str[0];
    local_48._5_1_ = ptVar4[-1].str[1];
    local_48._6_1_ = ptVar4[-1].str[2];
    local_48._7_1_ = ptVar4[-1].str[3];
    uStack_40 = *(undefined8 *)(ptVar4[-1].str + 4);
    pcVar2 = cm_utf8_decode_character(pcVar6,(char *)&uStack_40,&local_4c);
    if (pcVar2 == (char *)0x0) {
      report_good(false,pcVar6);
      puts("failed");
LAB_0012c872:
      iVar3 = 1;
    }
    else {
      if (local_4c != uStack_40._4_4_) {
        report_good(false,pcVar6);
        pcVar2 = "expected 0x%04X, got 0x%04X\n";
        uVar5 = local_4c;
        uVar1 = uStack_40._4_4_;
LAB_0012c86b:
        printf(pcVar2,(ulong)uVar1,(ulong)uVar5);
        goto LAB_0012c872;
      }
      uVar5 = (int)pcVar2 - (int)pcVar6;
      if ((uint)local_48 != uVar5) {
        report_good(false,pcVar6);
        pcVar2 = "had %d bytes, used %d\n";
        uVar1 = (uint)local_48;
        goto LAB_0012c86b;
      }
      report_good(true,pcVar6);
      printf("got 0x%04X\n",(ulong)local_4c);
    }
    if (ptVar4->n == 0) {
      pcVar6 = bad_chars[0] + 4;
      do {
        first = (test_utf8_char *)(pcVar6 + -4);
        local_48 = CONCAT44(local_48._4_4_,0xffff);
        pcVar2 = cm_utf8_decode_character((char *)first,pcVar6,(uint *)&local_48);
        if (pcVar2 == (char *)0x0) {
          report_bad(true,(char *)first);
          puts("failed as expected");
        }
        else {
          report_bad(false,(char *)first);
          printf("expected failure, got 0x%04X\n",local_48 & 0xffffffff);
          iVar3 = 1;
        }
        pcVar2 = pcVar6 + 1;
        pcVar6 = pcVar6 + 5;
      } while (*pcVar2 != '\0');
      return iVar3;
    }
  } while( true );
}

Assistant:

int testUTF8(int, char*[])
{
  int result = 0;
  for(test_utf8_entry const* e = good_entry; e->n; ++e)
    {
    if(!decode_good(*e))
      {
      result = 1;
      }
    }
  for(test_utf8_char const* c = bad_chars; (*c)[0]; ++c)
    {
    if(!decode_bad(*c))
      {
      result = 1;
      }
    }
  return result;
}